

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

void __thiscall
toml::basic_value<toml::type_config>::basic_value
          (basic_value<toml::type_config> *this,integer_type x,integer_format_info *fmt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *com,region_type *reg)

{
  value_with_format<long,_toml::integer_format_info> *in_RCX;
  value_type_conflict4 in_RDX;
  undefined1 *in_RDI;
  region *this_00;
  region *in_stack_ffffffffffffff48;
  format_type *in_stack_ffffffffffffff50;
  
  *in_RDI = 2;
  integer_format_info::integer_format_info
            (in_stack_ffffffffffffff50,(integer_format_info *)in_stack_ffffffffffffff48);
  toml::detail::value_with_format<long,_toml::integer_format_info>::value_with_format
            (in_RCX,in_RDX,in_stack_ffffffffffffff50);
  integer_format_info::~integer_format_info((integer_format_info *)0x69e67b);
  this_00 = (region *)(in_RDI + 0x48);
  toml::detail::region::region(this_00,in_stack_ffffffffffffff48);
  preserve_comments::preserve_comments
            ((preserve_comments *)this_00,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffff48);
  return;
}

Assistant:

basic_value(integer_type x, integer_format_info fmt, std::vector<std::string> com, region_type reg)
        : type_(value_t::integer), integer_(integer_storage(std::move(x), std::move(fmt))),
          region_(std::move(reg)), comments_(std::move(com))
    {}